

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS ref_grid_orient_twod(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  REF_CELL pRVar1;
  REF_GRID ref_grid_00;
  REF_STATUS RVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  undefined8 uVar6;
  int iVar7;
  REF_BOOL valid;
  REF_GRID local_b0;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  pRVar1 = ref_grid->cell[3];
  local_b0 = ref_grid;
  for (iVar7 = 0; iVar7 < pRVar1->max; iVar7 = iVar7 + 1) {
    RVar2 = ref_cell_nodes(pRVar1,iVar7,nodes);
    if (RVar2 == 0) {
      uVar3 = ref_node_tri_twod_orientation(ref_node,nodes,&valid);
      if (uVar3 != 0) {
        uVar6 = 0x30f;
        goto LAB_00156ab2;
      }
      if (valid == 0) {
        iVar5 = -1;
        for (lVar4 = 0; (int)lVar4 < pRVar1->node_per; lVar4 = lVar4 + 1) {
          pRVar1->c2n[(long)pRVar1->size_per * (long)iVar7 + lVar4] =
               nodes[pRVar1->node_per + iVar5];
          iVar5 = iVar5 + -1;
        }
      }
    }
  }
  pRVar1 = local_b0->cell[6];
  iVar7 = 0;
  do {
    ref_grid_00 = local_b0;
    if (pRVar1->max <= iVar7) {
      pRVar1 = local_b0->cell[0];
      iVar7 = 0;
      do {
        if (pRVar1->max <= iVar7) {
          return 0;
        }
        RVar2 = ref_cell_nodes(pRVar1,iVar7,nodes);
        if (RVar2 == 0) {
          uVar3 = ref_grid_orient_edg(ref_grid_00,nodes);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x325,"ref_grid_orient_twod",(ulong)uVar3,"orient_edge");
            return uVar3;
          }
          for (lVar4 = 0; lVar4 < pRVar1->node_per; lVar4 = lVar4 + 1) {
            pRVar1->c2n[(long)pRVar1->size_per * (long)iVar7 + lVar4] = nodes[lVar4];
          }
        }
        iVar7 = iVar7 + 1;
      } while( true );
    }
    RVar2 = ref_cell_nodes(pRVar1,iVar7,nodes);
    if (RVar2 == 0) {
      uVar3 = ref_node_tri_twod_orientation(ref_node,nodes,&valid);
      if (uVar3 != 0) {
        uVar6 = 0x31a;
LAB_00156ab2:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               uVar6,"ref_grid_orient_twod",(ulong)uVar3,"valid");
        return uVar3;
      }
      if (valid == 0) {
        iVar5 = -1;
        for (lVar4 = 0; (int)lVar4 < pRVar1->node_per; lVar4 = lVar4 + 1) {
          pRVar1->c2n[(long)pRVar1->size_per * (long)iVar7 + lVar4] =
               nodes[pRVar1->node_per + iVar5];
          iVar5 = iVar5 + -1;
        }
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_grid_orient_twod(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL valid;
  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
    if (!valid) {
      each_ref_cell_cell_node(ref_cell, cell_node) {
        ref_cell_c2n(ref_cell, cell_node, cell) =
            nodes[ref_cell_node_per(ref_cell) - 1 - cell_node];
      }
    }
  }
  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    /* uses tri formed from first three nodes of quad for orientation */
    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
    if (!valid) {
      each_ref_cell_cell_node(ref_cell, cell_node) {
        ref_cell_c2n(ref_cell, cell_node, cell) =
            nodes[ref_cell_node_per(ref_cell) - 1 - cell_node];
      }
    }
  }
  /* orient edge after tri and quad sorted to use them as reference */
  ref_cell = ref_grid_edg(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_grid_orient_edg(ref_grid, nodes), "orient_edge");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      ref_cell_c2n(ref_cell, cell_node, cell) = nodes[cell_node];
    }
  }
  return REF_SUCCESS;
}